

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Vector<Converter::Impl::RawDeclarationVariable> * __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable_alias_group
          (Vector<Converter::Impl::RawDeclarationVariable> *__return_storage_ptr__,Impl *this,
          BindlessInfo *base_info,Vector<RawDeclaration> *raw_decls)

{
  bool bVar1;
  size_type __n;
  reference pRVar2;
  undefined1 local_84 [8];
  BindlessInfo info;
  RawDeclarationVariable var;
  RawDeclaration *decl;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<RawDeclaration> *__range1;
  Vector<RawDeclaration> *raw_decls_local;
  BindlessInfo *base_info_local;
  Impl *this_local;
  Vector<RawDeclarationVariable> *decls;
  
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::vector(__return_storage_ptr__);
  __n = std::
        vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
        ::size(raw_decls);
  std::
  vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ::reserve(__return_storage_ptr__,__n);
  __end1 = std::
           vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
           ::begin(raw_decls);
  decl = (RawDeclaration *)
         std::
         vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
         ::end(raw_decls);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
                                     *)&decl), bVar1) {
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
             ::operator*(&__end1);
    memset(&info.desc_set,0,0x10);
    info.desc_set = pRVar2->type;
    info.binding = pRVar2->width;
    memcpy(local_84,base_info,0x24);
    local_84[1] = raw_width_to_component_type(pRVar2->type,pRVar2->width);
    local_84._4_4_ = pRVar2->vecsize;
    create_bindless_heap_variable(this,(BindlessInfo *)local_84);
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::push_back(__return_storage_ptr__,(value_type *)&info.desc_set);
    __gnu_cxx::
    __normal_iterator<const_dxil_spv::Converter::Impl::RawDeclaration_*,_std::vector<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Converter::Impl::RawDeclarationVariable>
Converter::Impl::create_bindless_heap_variable_alias_group(const BindlessInfo &base_info,
                                                           const Vector<RawDeclaration> &raw_decls)
{
	Vector<RawDeclarationVariable> decls;
	decls.reserve(raw_decls.size());

	for (auto &decl : raw_decls)
	{
		RawDeclarationVariable var = {};
		var.declaration = decl;

		auto info = base_info;
		info.component = raw_width_to_component_type(decl.type, decl.width);
		info.raw_vecsize = decl.vecsize;
		var.var_id = create_bindless_heap_variable(info);
		decls.push_back(var);
	}

	return decls;
}